

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_delta_decoder.h
# Opt level: O1

bool __thiscall
draco::
PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>::
ComputeOriginalValues
          (PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>
           *this,CorrType *in_corr,int *out_data,int size,int num_components,PointIndex *param_5)

{
  _Type *__s;
  long lVar1;
  ulong __n;
  long lVar2;
  long lVar3;
  Point2 corr;
  Point2 orig;
  undefined1 local_58 [24];
  Point2 local_40;
  Transform *local_38;
  
  lVar1 = (long)num_components;
  __n = 0xffffffffffffffff;
  if (-1 < num_components) {
    __n = lVar1 * 4;
  }
  local_58._8_4_ = num_components;
  local_58._12_4_ = size;
  __s = (_Type *)operator_new__(__n);
  memset(__s,0,__n);
  local_38 = &(this->
              super_PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronDecodingTransform<int>_>
              ).transform_;
  local_40.v_._M_elems = *(array<int,_2UL> *)__s;
  local_58._16_8_ = __s;
  PredictionSchemeNormalOctahedronDecodingTransform<int>::ComputeOriginalValue
            ((PredictionSchemeNormalOctahedronDecodingTransform<int> *)local_58,(Point2 *)local_38,
             &local_40);
  *(undefined8 *)out_data = local_58._0_8_;
  if ((int)local_58._8_4_ < (int)local_58._12_4_) {
    lVar2 = (long)(int)local_58._12_4_;
    lVar3 = 0;
    do {
      local_40.v_._M_elems = *(array<int,_2UL> *)(out_data + lVar3);
      PredictionSchemeNormalOctahedronDecodingTransform<int>::ComputeOriginalValue
                ((PredictionSchemeNormalOctahedronDecodingTransform<int> *)local_58,
                 (Point2 *)local_38,&local_40);
      *(undefined8 *)(out_data + lVar1 + lVar3) = local_58._0_8_;
      lVar3 = lVar3 + lVar1;
    } while (lVar1 + lVar3 < lVar2);
  }
  operator_delete__((void *)local_58._16_8_);
  return true;
}

Assistant:

bool PredictionSchemeDeltaDecoder<DataTypeT, TransformT>::ComputeOriginalValues(
    const CorrType *in_corr, DataTypeT *out_data, int size, int num_components,
    const PointIndex *) {
  this->transform().Init(num_components);
  // Decode the original value for the first element.
  std::unique_ptr<DataTypeT[]> zero_vals(new DataTypeT[num_components]());
  this->transform().ComputeOriginalValue(zero_vals.get(), in_corr, out_data);

  // Decode data from the front using D(i) = D(i) + D(i - 1).
  for (int i = num_components; i < size; i += num_components) {
    this->transform().ComputeOriginalValue(out_data + i - num_components,
                                           in_corr + i, out_data + i);
  }
  return true;
}